

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_SplitByCStr_Test<wchar_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_SplitByCStr_Test<wchar_t> *this)

{
  long lVar1;
  char *in_R9;
  long *plVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> s1;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  re1_2;
  AssertionResult iutest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> re1_1 [3];
  allocator<char> local_2c9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_2c8;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_2a8;
  string local_290;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  bool local_250;
  AssertionHelper local_248;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [392];
  
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_2c8,L"arikitari na_world!",L"");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_218,L"arikitari",L"");
  local_1f8[0] = local_1e8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1f8,L"na",L"");
  plVar2 = local_1c8;
  local_1d8[0] = plVar2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1d8,L"world!",L"");
  local_1b0._0_8_ = L"_ ";
  detail::
  operator|<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_const_wchar_t_*,_true,_false,_nullptr>
            (&local_2a8,&local_2c8,(split_helper<const_wchar_t_*,_false,_true,_false> *)local_1b0);
  if ((long)local_2a8.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_2a8.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    local_250 = std::__equal<false>::
                equal<std::__cxx11::wstring_const*,std::__cxx11::wstring_const*>
                          (&local_218,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)local_1b8,
                           local_2a8.
                           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    local_270 = &local_260;
    local_268 = 0;
    local_260 = 0;
    if (local_250) {
      StringSplitLvalue_SplitByCStr::without_char<wchar_t,_nullptr>();
      goto LAB_0018df84;
    }
  }
  else {
    local_250 = false;
  }
  local_260 = 0;
  local_268 = 0;
  local_270 = &local_260;
  memset((iu_global_format_stringstream *)local_1b0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_290,(internal *)&local_270,
             (AssertionResult *)
             "std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end())","false",
             "true",in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,local_290._M_dataplus._M_p,&local_2c9);
  local_248.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
  ;
  local_248.m_part_result.super_iuCodeMessage.m_line = 0x141;
  local_248.m_part_result.super_iuCodeMessage._44_4_ = 2;
  iutest::AssertionHelper::OnFixed(&local_248,(Fixed *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_248.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_248.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  if (local_270 != &local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
LAB_0018df84:
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_2a8);
  lVar1 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}